

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O2

void __thiscall
hsql::PrepareStatement::setPlaceholders
          (PrepareStatement *this,vector<void_*,_std::allocator<void_*>_> *ph)

{
  pointer ppvVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  ulong uVar4;
  uintmax_t i;
  long lVar5;
  __normal_iterator<hsql::Expr_**,_std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>_> __i;
  pointer ppvVar6;
  pointer ppEVar7;
  Expr *local_30;
  
  ppvVar1 = (ph->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppvVar6 = (ph->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppvVar6 != ppvVar1; ppvVar6 = ppvVar6 + 1) {
    if ((Expr *)*ppvVar6 != (Expr *)0x0) {
      local_30 = (Expr *)*ppvVar6;
      std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>::emplace_back<hsql::Expr*>
                ((vector<hsql::Expr*,std::allocator<hsql::Expr*>> *)&this->placeholders,&local_30);
    }
  }
  ppEVar2 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar3) {
    uVar4 = (long)ppEVar3 - (long)ppEVar2 >> 3;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
              (ppEVar2,ppEVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppEVar3 - (long)ppEVar2 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
                (ppEVar2,ppEVar3);
    }
    else {
      ppEVar7 = ppEVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,__gnu_cxx::__ops::_Iter_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
                (ppEVar2,ppEVar7);
      for (; ppEVar7 != ppEVar3; ppEVar7 = ppEVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,__gnu_cxx::__ops::_Val_comp_iter<hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>>
                  (ppEVar7);
      }
    }
  }
  ppEVar2 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (this->placeholders).super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (lVar5 = 0; (long)ppEVar3 - (long)ppEVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    ppEVar2[lVar5]->ival = lVar5;
  }
  return;
}

Assistant:

void PrepareStatement::setPlaceholders(std::vector<void*> ph) {
    for (void* e : ph) {
      if (e != NULL)
        placeholders.push_back((Expr*) e);
    }
    // Sort by col-id
    std::sort(placeholders.begin(), placeholders.end(), [](Expr * i, Expr * j) -> bool { return (i->ival < j->ival); });

    // Set the placeholder id on the Expr. This replaces the previously stored column id
    for (uintmax_t i = 0; i < placeholders.size(); ++i) placeholders[i]->ival = i;
  }